

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaTypeFixupWhitespace(xmlSchemaTypePtr type)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  xmlSchemaFacetLinkPtr pxVar4;
  xmlSchemaTypePtr pxVar5;
  
  uVar1 = type->flags;
  uVar3 = 0x4000000;
  if ((uVar1 & 0x40) != 0) goto LAB_001bf701;
  if ((char)uVar1 < '\0') {
    return 0;
  }
  for (pxVar4 = type->facetSet; pxVar5 = type, pxVar4 != (xmlSchemaFacetLinkPtr)0x0;
      pxVar4 = pxVar4->next) {
    if (pxVar4->facet->type == XML_SCHEMA_FACET_WHITESPACE) {
      uVar3 = pxVar4->facet->whitespace - 1;
      if (2 < uVar3) {
        return -1;
      }
      uVar3 = *(uint *)(&DAT_001f8284 + (ulong)uVar3 * 4);
      goto LAB_001bf701;
    }
  }
  do {
    pxVar5 = pxVar5->baseType;
    if (pxVar5 == (xmlSchemaTypePtr)0x0) {
      return 0;
    }
    iVar2 = pxVar5->builtInType;
    if (iVar2 == 0x2d) {
      return 0;
    }
  } while (pxVar5->type != XML_SCHEMA_TYPE_BASIC);
  if (iVar2 != 0x2e) {
    if (iVar2 == 2) {
      uVar3 = 0x2000000;
      goto LAB_001bf701;
    }
    if (iVar2 != 1) goto LAB_001bf701;
  }
  uVar3 = 0x1000000;
LAB_001bf701:
  type->flags = uVar1 | uVar3;
  return 0;
}

Assistant:

static int
xmlSchemaTypeFixupWhitespace(xmlSchemaTypePtr type)
{


    /*
    * Evaluate the whitespace-facet value.
    */
    if (WXS_IS_LIST(type)) {
	type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_COLLAPSE;
	return (0);
    } else if (WXS_IS_UNION(type))
	return (0);

    if (type->facetSet != NULL) {
	xmlSchemaFacetLinkPtr lin;

	for (lin = type->facetSet; lin != NULL; lin = lin->next) {
	    if (lin->facet->type == XML_SCHEMA_FACET_WHITESPACE) {
		switch (lin->facet->whitespace) {
		case XML_SCHEMAS_FACET_PRESERVE:
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_PRESERVE;
		    break;
		case XML_SCHEMAS_FACET_REPLACE:
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_REPLACE;
		    break;
		case XML_SCHEMAS_FACET_COLLAPSE:
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_COLLAPSE;
		    break;
		default:
		    return (-1);
		}
		return (0);
	    }
	}
    }
    /*
    * For all `atomic` datatypes other than string (and types `derived`
    * by `restriction` from it) the value of whiteSpace is fixed to
    * collapse
    */
    {
	xmlSchemaTypePtr anc;

	for (anc = type->baseType; anc != NULL &&
		anc->builtInType != XML_SCHEMAS_ANYTYPE;
		anc = anc->baseType) {

	    if (anc->type == XML_SCHEMA_TYPE_BASIC) {
		if (anc->builtInType == XML_SCHEMAS_NORMSTRING) {
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_REPLACE;

		} else if ((anc->builtInType == XML_SCHEMAS_STRING) ||
		    (anc->builtInType == XML_SCHEMAS_ANYSIMPLETYPE)) {
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_PRESERVE;

		} else
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_COLLAPSE;
		break;
	    }
	}
    }
    return (0);
}